

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

ExecState __thiscall
Process::startInternal
          (Process *this,Path *command,List<String> *a,List<String> *environment,int timeout,
          uint execFlags)

{
  ulong *puVar1;
  pointer pSVar2;
  Process *pPVar3;
  __fd_mask _Var4;
  bool bVar5;
  int iVar6;
  __pid_t _Var7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  ssize_t sVar14;
  String *pSVar15;
  pointer pSVar16;
  int iVar17;
  int iVar18;
  ExecState EVar19;
  pointer pSVar20;
  timeval *__timeout;
  ulong uVar21;
  char *path;
  const_iterator it;
  long lVar22;
  int closePipe [2];
  fd_set rfds;
  timeval timeoutForSelect;
  List<String> arguments;
  timeval now;
  timeval started;
  Path cmd;
  char c;
  int local_214;
  int local_210;
  uint local_20c;
  String *local_208;
  string *local_200;
  Process *local_1f8;
  String *local_1f0;
  int *local_1e8;
  Signal<std::function<void_(Process_*)>_> *local_1e0;
  int *local_1d8;
  int *local_1d0;
  undefined1 local_1c8 [32];
  _Any_data local_1a8;
  code *local_198;
  code *pcStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  timeval local_120;
  vector<String,_std::allocator<String>_> local_110;
  timeval local_f8;
  timeval local_e8;
  Path local_d8;
  fd_set local_b8;
  
  local_1e8 = (int *)CONCAT44(local_1e8._4_4_,execFlags);
  (this->mErrorString).mString._M_string_length = 0;
  *(this->mErrorString).mString._M_dataplus._M_p = '\0';
  pSVar20 = (environment->super_vector<String,_std::allocator<String>_>).
            super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
            _M_start;
  pSVar2 = (environment->super_vector<String,_std::allocator<String>_>).
           super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  local_20c = timeout;
  local_208 = (String *)environment;
  local_1f8 = this;
  if (pSVar20 == pSVar2) {
    path = (char *)0x0;
  }
  else {
    path = (char *)0x0;
    do {
      bVar5 = String::startsWith(pSVar20,"PATH=",0xffffffffffffffff,CaseSensitive);
      if (bVar5) {
        path = (pSVar20->mString)._M_dataplus._M_p + 5;
        break;
      }
      pSVar20 = pSVar20 + 1;
    } while (pSVar20 != pSVar2);
  }
  pPVar3 = local_1f8;
  local_200 = (string *)&local_1f8->mErrorString;
  findCommand(&local_d8,&command->super_String,path);
  if (local_d8.super_String.mString._M_string_length == 0) {
    String::String((String *)&local_1a8,"Command not found",0xffffffffffffffff);
    std::__cxx11::string::operator=(local_200,(string *)local_1a8._M_pod_data);
    if ((code **)local_1a8._M_unused._0_8_ != &local_198) {
      operator_delete(local_1a8._M_unused._M_object);
    }
    EVar19 = Error;
    goto LAB_00172643;
  }
  std::vector<String,_std::allocator<String>_>::vector
            (&local_110,&a->super_vector<String,_std::allocator<String>_>);
  do {
    iVar6 = pipe(&local_214);
    if (iVar6 != -1) break;
    piVar10 = __errno_location();
  } while (*piVar10 == 4);
  bVar5 = SocketClient::setFlags(local_210,1,1,2,FlagAppend);
  if (bVar5) {
    piVar10 = pPVar3->mStdIn;
    do {
      iVar6 = pipe(piVar10);
      if (iVar6 != -1) break;
      piVar11 = __errno_location();
    } while (*piVar11 == 4);
    piVar11 = pPVar3->mStdOut;
    do {
      iVar6 = pipe(piVar11);
      if (iVar6 != -1) break;
      piVar12 = __errno_location();
    } while (*piVar12 == 4);
    piVar12 = pPVar3->mStdErr;
    do {
      iVar6 = pipe(piVar12);
      if (iVar6 != -1) break;
      piVar13 = __errno_location();
    } while (*piVar13 == 4);
    local_1d0 = piVar12;
    if (pPVar3->mMode == Sync) {
      do {
        iVar6 = pipe(pPVar3->mSync);
        if (iVar6 != -1) break;
        piVar12 = __errno_location();
      } while (*piVar12 == 4);
    }
    lVar22 = (long)local_110.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_110.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5;
    local_1f0 = (String *)operator_new__(-(ulong)(lVar22 + 2U >> 0x3d != 0) | lVar22 * 8 + 0x10U);
    (&(local_1f0->mString)._M_string_length)[lVar22] = 0;
    (local_1f0->mString)._M_dataplus._M_p = local_d8.super_String.mString._M_dataplus._M_p;
    pSVar15 = local_1f0;
    for (; local_110.super__Vector_base<String,_std::allocator<String>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_110.super__Vector_base<String,_std::allocator<String>_>._M_impl.
           super__Vector_impl_data._M_finish;
        local_110.super__Vector_base<String,_std::allocator<String>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_110.super__Vector_base<String,_std::allocator<String>_>._M_impl.
             super__Vector_impl_data._M_start + 1) {
      pSVar15 = (String *)&(pSVar15->mString)._M_string_length;
      *(pointer *)pSVar15 =
           ((local_110.super__Vector_base<String,_std::allocator<String>_>._M_impl.
             super__Vector_impl_data._M_start)->mString)._M_dataplus._M_p;
    }
    pSVar20 = (((_Vector_base<String,_std::allocator<String>_> *)&(local_208->mString)._M_dataplus)
              ->_M_impl).super__Vector_impl_data._M_start;
    pSVar2 = (pointer)(local_208->mString)._M_string_length;
    lVar22 = (long)pSVar2 - (long)pSVar20 >> 5;
    uVar21 = 0xffffffffffffffff;
    if (lVar22 + 1U < 0x2000000000000000) {
      uVar21 = lVar22 * 8 + 8;
    }
    local_208 = (String *)operator_new__(uVar21);
    piVar12 = local_1d0;
    (&(((_Vector_base<String,_std::allocator<String>_> *)&(local_208->mString)._M_dataplus)->_M_impl
      ).super__Vector_impl_data._M_start)[lVar22] = (pointer)0x0;
    pSVar15 = local_208;
    for (pSVar16 = pSVar20; pSVar16 != pSVar2; pSVar16 = pSVar16 + 1) {
      (((_Vector_base<String,_std::allocator<String>_> *)&(pSVar15->mString)._M_dataplus)->_M_impl).
      super__Vector_impl_data._M_start = (pointer)(pSVar16->mString)._M_dataplus._M_p;
      pSVar15 = (String *)&(pSVar15->mString)._M_string_length;
    }
    ProcessThread::setPending(1);
    _Var7 = fork();
    pPVar3 = local_1f8;
    local_1f8->mPid = _Var7;
    if (_Var7 == -1) {
      ProcessThread::setPending(-1);
      pPVar3 = local_1f8;
      do {
        iVar6 = close(pPVar3->mStdIn[1]);
        if (iVar6 != -1) break;
        piVar13 = __errno_location();
      } while (*piVar13 == 4);
      do {
        iVar6 = close(*piVar10);
        if (iVar6 != -1) break;
        piVar13 = __errno_location();
      } while (*piVar13 == 4);
      do {
        iVar6 = close(pPVar3->mStdOut[1]);
        if (iVar6 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        iVar6 = close(*piVar11);
        if (iVar6 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        iVar6 = close(pPVar3->mStdErr[1]);
        if (iVar6 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        iVar6 = close(*piVar12);
        if (iVar6 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        iVar6 = close(local_210);
        if (iVar6 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        iVar6 = close(local_214);
        if (iVar6 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      String::String((String *)&local_1a8,"Fork failed",0xffffffffffffffff);
      std::__cxx11::string::operator=(local_200,(string *)local_1a8._M_pod_data);
      if ((code **)local_1a8._M_unused._0_8_ != &local_198) {
        operator_delete(local_1a8._M_unused._M_object);
      }
      operator_delete__(local_208);
      operator_delete__(local_1f0);
    }
    else {
      if (_Var7 == 0) {
        do {
          iVar6 = close(local_214);
          pPVar3 = local_1f8;
          if (iVar6 != -1) break;
          piVar12 = __errno_location();
          pPVar3 = local_1f8;
        } while (*piVar12 == 4);
        do {
          iVar6 = close(pPVar3->mStdIn[1]);
          if (iVar6 != -1) break;
          piVar12 = __errno_location();
        } while (*piVar12 == 4);
        do {
          iVar6 = close(*piVar11);
          piVar12 = local_1d0;
          if (iVar6 != -1) break;
          piVar13 = __errno_location();
          piVar12 = local_1d0;
        } while (*piVar13 == 4);
        do {
          iVar6 = close(*piVar12);
          if (iVar6 != -1) break;
          piVar11 = __errno_location();
        } while (*piVar11 == 4);
        do {
          iVar6 = close(0);
          if (iVar6 != -1) break;
          piVar11 = __errno_location();
        } while (*piVar11 == 4);
        do {
          iVar6 = close(1);
          if (iVar6 != -1) break;
          piVar11 = __errno_location();
        } while (*piVar11 == 4);
        do {
          iVar6 = close(2);
          if (iVar6 != -1) break;
          piVar11 = __errno_location();
        } while (*piVar11 == 4);
        do {
          iVar6 = dup2(*piVar10,0);
          if (iVar6 != -1) break;
          piVar11 = __errno_location();
        } while (*piVar11 == 4);
        do {
          iVar6 = close(*piVar10);
          pPVar3 = local_1f8;
          if (iVar6 != -1) break;
          piVar11 = __errno_location();
          pPVar3 = local_1f8;
        } while (*piVar11 == 4);
        do {
          iVar6 = dup2(pPVar3->mStdOut[1],1);
          if (iVar6 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        do {
          iVar6 = close(pPVar3->mStdOut[1]);
          if (iVar6 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        do {
          iVar6 = dup2(pPVar3->mStdErr[1],2);
          if (iVar6 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        do {
          iVar6 = close(pPVar3->mStdErr[1]);
          if (iVar6 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        if ((((pPVar3->mChRoot).super_String.mString._M_string_length == 0) ||
            (iVar6 = chroot((local_1f8->mChRoot).super_String.mString._M_dataplus._M_p), iVar6 == 0)
            ) && (((local_1f8->mCwd).super_String.mString._M_string_length == 0 ||
                  (iVar6 = chdir((local_1f8->mCwd).super_String.mString._M_dataplus._M_p),
                  iVar6 == 0)))) {
          if (pSVar20 == pSVar2) {
            execv(local_d8.super_String.mString._M_dataplus._M_p,(char **)local_1f0);
          }
          else {
            execve(local_d8.super_String.mString._M_dataplus._M_p,(char **)local_1f0,
                   (char **)local_208);
          }
        }
        local_1a8._M_pod_data[0] = 99;
        do {
          sVar14 = ::write(local_210,&local_1a8,1);
          if ((int)sVar14 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        do {
          iVar6 = close(local_210);
          if (iVar6 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        _exit(1);
      }
      operator_delete__(local_208);
      operator_delete__(local_1f0);
      do {
        iVar6 = close(local_210);
        if (iVar6 != -1) break;
        piVar13 = __errno_location();
      } while (*piVar13 == 4);
      do {
        iVar6 = close(*piVar10);
        if (iVar6 != -1) break;
        piVar13 = __errno_location();
      } while (*piVar13 == 4);
      do {
        iVar6 = close(pPVar3->mStdOut[1]);
        if (iVar6 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        iVar6 = close(pPVar3->mStdErr[1]);
        if (iVar6 != -1) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        uVar8 = fcntl(pPVar3->mStdIn[1],3,0);
        if (uVar8 != 0xffffffff) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      uVar8 = uVar8 | 0x800;
      do {
        iVar6 = fcntl(pPVar3->mStdIn[1],4,(ulong)uVar8);
        if (iVar6 != -1) break;
        piVar10 = __errno_location();
        uVar8 = 0xffffffff;
      } while (*piVar10 == 4);
      do {
        uVar8 = fcntl(*piVar11,3,0);
        if (uVar8 != 0xffffffff) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      uVar8 = uVar8 | 0x800;
      do {
        iVar6 = fcntl(*piVar11,4,(ulong)uVar8);
        if (iVar6 != -1) break;
        piVar10 = __errno_location();
        uVar8 = 0xffffffff;
      } while (*piVar10 == 4);
      do {
        uVar8 = fcntl(*piVar12,3,0);
        if (uVar8 != 0xffffffff) break;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      uVar8 = uVar8 | 0x800;
      do {
        iVar6 = fcntl(*piVar12,4,(ulong)uVar8);
        if (iVar6 != -1) break;
        piVar10 = __errno_location();
        uVar8 = 0xffffffff;
      } while (*piVar10 == 4);
      do {
        sVar14 = read(local_214,&local_b8,1);
        iVar6 = (int)sVar14;
        if (iVar6 != -1) {
          if (iVar6 == 0) goto LAB_00172087;
          if (iVar6 == 1) goto LAB_00172006;
          goto LAB_00172095;
        }
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      do {
        iVar6 = close(local_214);
        if (iVar6 != -1) break;
      } while (*piVar10 == 4);
      String::String((String *)&local_1a8,"Failed to read from closePipe during process start",
                     0xffffffffffffffff);
      std::__cxx11::string::operator=(local_200,(string *)local_1a8._M_pod_data);
      if ((code **)local_1a8._M_unused._0_8_ != &local_198) {
        operator_delete(local_1a8._M_unused._M_object);
      }
      pPVar3->mPid = -1;
      ProcessThread::setPending(-1);
      pPVar3->mReturn = -1;
    }
    goto LAB_00172634;
  }
  String::String((String *)&local_1a8,"Unable to set FD_CLOEXEC",0xffffffffffffffff);
  std::__cxx11::string::operator=(local_200,(string *)local_1a8._M_pod_data);
  if ((code **)local_1a8._M_unused._0_8_ != &local_198) {
    operator_delete(local_1a8._M_unused._M_object);
  }
  do {
    iVar6 = close(local_214);
    if (iVar6 != -1) break;
    piVar10 = __errno_location();
  } while (*piVar10 == 4);
  EVar19 = Error;
  do {
    iVar6 = close(local_210);
    if (iVar6 != -1) break;
    piVar10 = __errno_location();
  } while (*piVar10 == 4);
  goto LAB_00172636;
  while (piVar10 = __errno_location(), *piVar10 == 4) {
LAB_00172087:
    iVar6 = close(local_214);
    if (iVar6 != -1) break;
  }
LAB_00172095:
  ProcessThread::addPid(pPVar3->mPid,pPVar3,pPVar3->mMode == Async);
  if (pPVar3->mMode == Async) {
    EventLoop::eventLoop();
    _Var4 = local_b8.fds_bits[0];
    if ((EventLoop *)local_b8.fds_bits[0] != (EventLoop *)0x0) {
      iVar6 = *piVar11;
      local_1a8._8_8_ = 0;
      local_1a8._M_unused._M_object = operator_new(0x18);
      *(code **)local_1a8._M_unused._0_8_ = processCallback;
      *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 8) = 0;
      *(Process **)((long)local_1a8._M_unused._0_8_ + 0x10) = pPVar3;
      pcStack_190 = std::
                    _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                    ::_M_invoke;
      local_198 = std::
                  _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                  ::_M_manager;
      EventLoop::registerSocket
                ((EventLoop *)_Var4,iVar6,1,(function<void_(int,_unsigned_int)> *)&local_1a8);
      if (local_198 != (code *)0x0) {
        (*local_198)(&local_1a8,&local_1a8,3);
      }
      _Var4 = local_b8.fds_bits[0];
      uVar8 = *piVar12;
      local_1a8._8_8_ = 0;
      local_1a8._M_unused._M_object = operator_new(0x18);
      *(code **)local_1a8._M_unused._0_8_ = processCallback;
      *(code **)((long)local_1a8._M_unused._0_8_ + 8) = (code *)0x0;
      *(Process **)((long)local_1a8._M_unused._0_8_ + 0x10) = pPVar3;
      pcStack_190 = std::
                    _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                    ::_M_invoke;
      local_198 = std::
                  _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                  ::_M_manager;
      EventLoop::registerSocket
                ((EventLoop *)_Var4,uVar8,1,(function<void_(int,_unsigned_int)> *)&local_1a8);
      if (local_198 != (code *)0x0) {
        (*local_198)(&local_1a8,&local_1a8,3);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.fds_bits[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.fds_bits[1]);
    }
  }
  else {
    if (0 < (int)local_20c) {
      Rct::gettime(&local_e8);
      local_120.tv_sec = (ulong)local_20c / 1000;
      local_120.tv_usec = (ulong)((local_20c % 1000) * 1000);
    }
    if (((ulong)local_1e8 & 1) == 0) {
      closeStdIn(pPVar3,CloseForce);
      pPVar3->mWantStdInClosed = false;
    }
    __timeout = &local_120;
    if ((int)local_20c < 1) {
      __timeout = (timeval *)0x0;
    }
    local_208 = &pPVar3->mStdOutBuffer;
    local_1e8 = &pPVar3->mStdOutIndex;
    local_1f0 = &pPVar3->mStdErrBuffer;
    local_1d8 = &pPVar3->mStdErrIndex;
    local_1e0 = &pPVar3->mReadyReadStdErr;
    while( true ) {
      local_138 = 0;
      uStack_130 = 0;
      local_148 = 0;
      uStack_140 = 0;
      local_158 = 0;
      uStack_150 = 0;
      local_168 = 0;
      uStack_160 = 0;
      local_178 = 0;
      uStack_170 = 0;
      local_188 = 0;
      uStack_180 = 0;
      local_198 = (code *)0x0;
      pcStack_190 = (code *)0x0;
      local_1a8._M_unused._M_object = (code **)0x0;
      local_1a8._8_8_ = 0;
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      iVar6 = pPVar3->mStdOut[0];
      iVar18 = iVar6 + 0x3f;
      if (-1 < iVar6) {
        iVar18 = iVar6;
      }
      puVar1 = (ulong *)((long)&local_1a8 + (long)(iVar18 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar6 & 0x3f);
      iVar18 = pPVar3->mStdErr[0];
      iVar17 = iVar18 + 0x3f;
      if (-1 < iVar18) {
        iVar17 = iVar18;
      }
      puVar1 = (ulong *)((long)&local_1a8 + (long)(iVar17 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar18 & 0x3f);
      if (iVar18 < iVar6) {
        iVar18 = iVar6;
      }
      iVar6 = pPVar3->mSync[0];
      iVar17 = iVar6 + 0x3f;
      if (-1 < iVar6) {
        iVar17 = iVar6;
      }
      puVar1 = (ulong *)((long)&local_1a8 + (long)(iVar17 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar6 & 0x3f);
      if (iVar18 <= iVar6) {
        iVar18 = iVar6;
      }
      if (iVar18 < 1) {
        iVar18 = 0;
      }
      iVar6 = pPVar3->mStdIn[1];
      iVar17 = iVar18;
      if (iVar6 != -1) {
        iVar17 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar17 = iVar6;
        }
        local_b8.fds_bits[iVar17 >> 6] = local_b8.fds_bits[iVar17 >> 6] | 1L << ((byte)iVar6 & 0x3f)
        ;
        iVar17 = iVar6;
        if (iVar6 < iVar18) {
          iVar17 = iVar18;
        }
      }
      while (iVar6 = select(iVar17 + 1,(fd_set *)&local_1a8,&local_b8,(fd_set *)0x0,__timeout),
            iVar6 == -1) {
        piVar10 = __errno_location();
        if (*piVar10 != 4) {
          String::String((String *)local_1c8,"Sync select failed: ",0xffffffffffffffff);
          std::__cxx11::string::operator=(local_200,(string *)local_1c8);
          if ((Process *)local_1c8._0_8_ != (Process *)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_);
          }
          Rct::strerror((Rct *)local_1c8,*piVar10);
          std::__cxx11::string::_M_append((char *)local_200,local_1c8._0_8_);
          if ((Process *)local_1c8._0_8_ != (Process *)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_);
          }
          goto LAB_00172634;
        }
      }
      uVar8 = *piVar11;
      uVar9 = uVar8 + 0x3f;
      if (-1 < (int)uVar8) {
        uVar9 = uVar8;
      }
      if ((*(ulong *)((long)&local_1a8 + (long)((int)uVar9 >> 6) * 8) >> ((ulong)uVar8 & 0x3f) & 1)
          != 0) {
        handleOutput(pPVar3,uVar8,local_208,local_1e8,&pPVar3->mReadyReadStdOut);
      }
      uVar8 = *piVar12;
      uVar9 = uVar8 + 0x3f;
      if (-1 < (int)uVar8) {
        uVar9 = uVar8;
      }
      if ((*(ulong *)((long)&local_1a8 + (long)((int)uVar9 >> 6) * 8) >> ((ulong)uVar8 & 0x3f) & 1)
          != 0) {
        handleOutput(pPVar3,uVar8,local_1f0,local_1d8,local_1e0);
      }
      uVar8 = pPVar3->mStdIn[1];
      if (uVar8 != 0xffffffff) {
        uVar9 = uVar8 + 0x3f;
        if (-1 < (int)uVar8) {
          uVar9 = uVar8;
        }
        if (((ulong)local_b8.fds_bits[(int)uVar9 >> 6] >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
          handleInput(pPVar3,uVar8);
        }
      }
      uVar8 = pPVar3->mSync[0];
      uVar9 = uVar8 + 0x3f;
      if (-1 < (int)uVar8) {
        uVar9 = uVar8;
      }
      if ((*(ulong *)((long)&local_1a8 + (long)((int)uVar9 >> 6) * 8) >> ((ulong)uVar8 & 0x3f) & 1)
          != 0) break;
      if (local_20c != 0) {
        Rct::gettime(&local_f8);
        iVar18 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_e8.tv_usec),8) >> 7) -
                 (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_e8.tv_usec),0xc) >> 0x1f)) +
                 (int)local_e8.tv_sec * -1000 +
                 ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_f8.tv_usec),8) >> 7) -
                 (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_f8.tv_usec),0xc) >> 0x1f)) +
                 (int)local_f8.tv_sec * 1000;
        iVar6 = local_20c - iVar18;
        if (iVar6 == 0 || (int)local_20c < iVar18) {
          iVar6 = pPVar3->mPid;
          if (pPVar3->mReturn == -2) {
            if (iVar6 == -1) {
              iVar6 = -1;
            }
            else {
              pPVar3->mReturn = -3;
              ::kill(iVar6,0xf);
              iVar6 = pPVar3->mPid;
            }
          }
          ProcessThread::removePid(iVar6);
          String::String((String *)local_1c8,"Timed out",0xffffffffffffffff);
          std::__cxx11::string::operator=(local_200,(string *)local_1c8);
          if ((Process *)local_1c8._0_8_ != (Process *)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_);
          }
          EVar19 = TimedOut;
          goto LAB_00172636;
        }
        local_120.tv_sec = (long)(iVar6 / 1000);
        local_120.tv_usec = (long)((iVar6 % 1000) * 1000);
      }
    }
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)&pPVar3->mMutex);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    if (pPVar3->mSync[1] != -1) {
      __assert_fail("mSync[1] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                    ,0x239,
                    "Process::ExecState Process::startInternal(const Path &, const List<String> &, const List<String> &, int, unsigned int)"
                   );
    }
    handleOutput(pPVar3,pPVar3->mStdOut[0],local_208,local_1e8,&pPVar3->mReadyReadStdOut);
    handleOutput(pPVar3,pPVar3->mStdErr[0],local_1f0,local_1d8,local_1e0);
    closeStdOut(pPVar3);
    closeStdErr(pPVar3);
    do {
      iVar6 = close(pPVar3->mSync[0]);
      if (iVar6 != -1) break;
      piVar10 = __errno_location();
    } while (*piVar10 == 4);
    pPVar3->mSync[0] = -1;
    pthread_mutex_unlock((pthread_mutex_t *)&pPVar3->mMutex);
    local_1c8._0_8_ = pPVar3;
    Signal<std::function<void(Process*)>>::operator()
              ((Signal<std::function<void(Process*)>> *)&pPVar3->mFinished,(Process **)local_1c8);
  }
  EVar19 = Done;
  goto LAB_00172636;
  while (piVar10 = __errno_location(), *piVar10 == 4) {
LAB_00172006:
    iVar6 = close(local_214);
    if (iVar6 != -1) break;
  }
  String::String((String *)&local_1a8,"Process failed to start",0xffffffffffffffff);
  std::__cxx11::string::operator=(local_200,(string *)local_1a8._M_pod_data);
  if ((code **)local_1a8._M_unused._0_8_ != &local_198) {
    operator_delete(local_1a8._M_unused._M_object);
  }
  pPVar3->mReturn = -1;
  pPVar3->mPid = -1;
  ProcessThread::setPending(-1);
LAB_00172634:
  EVar19 = Error;
LAB_00172636:
  std::vector<String,_std::allocator<String>_>::~vector(&local_110);
LAB_00172643:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.super_String.mString._M_dataplus._M_p != &local_d8.super_String.mString.field_2) {
    operator_delete(local_d8.super_String.mString._M_dataplus._M_p);
  }
  return EVar19;
}

Assistant:

Process::ExecState Process::startInternal(const Path &command, const List<String> &a, const List<String> &environment,
                                          int timeout, unsigned int execFlags)
{
    mErrorString.clear();

    const char *path = 0;
    for (const auto &it : environment) {
        if (it.startsWith("PATH=")) {
            path = it.constData() + 5;
            break;
        }
    }
    Path cmd = findCommand(command, path);
    if (cmd.isEmpty()) {
        mErrorString = "Command not found";
        return Error;
    }
    List<String> arguments = a;
    int err;

    int closePipe[2];
    eintrwrap(err, ::pipe(closePipe));
#ifdef HAVE_CLOEXEC
    if (!SocketClient::setFlags(closePipe[1], FD_CLOEXEC, F_GETFD, F_SETFD)) {
        mErrorString = "Unable to set FD_CLOEXEC";
        eintrwrap(err, ::close(closePipe[0]));
        eintrwrap(err, ::close(closePipe[1]));
        return Error;
    }
#else
#warning No CLOEXEC, Process might have problematic behavior
#endif

    eintrwrap(err, ::pipe(mStdIn));
    eintrwrap(err, ::pipe(mStdOut));
    eintrwrap(err, ::pipe(mStdErr));
    if (mMode == Sync)
        eintrwrap(err, ::pipe(mSync));

    const char **args = new const char*[arguments.size() + 2];
    // const char* args[arguments.size() + 2];
    args[arguments.size() + 1] = 0;
    args[0] = cmd.nullTerminated();
    int pos = 1;
    for (List<String>::const_iterator it = arguments.begin(); it != arguments.end(); ++it) {
        args[pos] = it->nullTerminated();
        // printf("arg: '%s'\n", args[pos]);
        ++pos;
    }

    const bool hasEnviron = !environment.empty();

    const char **env = new const char*[environment.size() + 1];
    env[environment.size()] = 0;

    if (hasEnviron) {
        pos = 0;
        //printf("fork, about to exec '%s'\n", cmd.nullTerminated());
        for (List<String>::const_iterator it = environment.begin(); it != environment.end(); ++it) {
            env[pos] = it->nullTerminated();
            //printf("env: '%s'\n", env[pos]);
            ++pos;
        }
    }

    ProcessThread::setPending(1);

    mPid = ::fork();
    if (mPid == -1) {
        //printf("fork, something horrible has happened %d\n", errno);
        // bail out

        ProcessThread::setPending(-1);

        eintrwrap(err, ::close(mStdIn[1]));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::close(mStdOut[0]));
        eintrwrap(err, ::close(mStdErr[1]));
        eintrwrap(err, ::close(mStdErr[0]));
        eintrwrap(err, ::close(closePipe[1]));
        eintrwrap(err, ::close(closePipe[0]));
        mErrorString = "Fork failed";
        delete[] env;
        delete[] args;
        return Error;
    } else if (mPid == 0) {
        //printf("fork, in child\n");
        // child, should do some error checking here really
        eintrwrap(err, ::close(closePipe[0]));
        eintrwrap(err, ::close(mStdIn[1]));
        eintrwrap(err, ::close(mStdOut[0]));
        eintrwrap(err, ::close(mStdErr[0]));

        eintrwrap(err, ::close(STDIN_FILENO));
        eintrwrap(err, ::close(STDOUT_FILENO));
        eintrwrap(err, ::close(STDERR_FILENO));

        eintrwrap(err, ::dup2(mStdIn[0], STDIN_FILENO));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::dup2(mStdOut[1], STDOUT_FILENO));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::dup2(mStdErr[1], STDERR_FILENO));
        eintrwrap(err, ::close(mStdErr[1]));

        int ret;
        if (!mChRoot.isEmpty() && ::chroot(mChRoot.constData())) {
            goto error;
        }
        if (!mCwd.isEmpty() && ::chdir(mCwd.constData())) {
            goto error;
        }
        if (hasEnviron) {
            ret = ::execve(cmd.nullTerminated(), const_cast<char* const*>(args), const_cast<char* const*>(env));
        } else {
            ret = ::execv(cmd.nullTerminated(), const_cast<char* const*>(args));
        }
        // notify the parent process
  error:
        const char c = 'c';
        eintrwrap(err, ::write(closePipe[1], &c, 1));
        eintrwrap(err, ::close(closePipe[1]));
        ::_exit(1);
        (void)ret;
        //printf("fork, exec seemingly failed %d, %d %s\n", ret, errno, Rct::strerror().constData());
    } else {
        delete[] env;
        delete[] args;

        // parent
        eintrwrap(err, ::close(closePipe[1]));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::close(mStdErr[1]));

        //printf("fork, in parent\n");

        int flags;
        eintrwrap(flags, fcntl(mStdIn[1], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdIn[1], F_SETFL, flags | O_NONBLOCK));
        eintrwrap(flags, fcntl(mStdOut[0], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdOut[0], F_SETFL, flags | O_NONBLOCK));
        eintrwrap(flags, fcntl(mStdErr[0], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdErr[0], F_SETFL, flags | O_NONBLOCK));

        // block until exec is called in the child or until exec fails
        {
            char c;
            eintrwrap(err, ::read(closePipe[0], &c, 1));
            (void)c;

            if (err == -1) {
                // bad
                eintrwrap(err, ::close(closePipe[0]));
                mErrorString = "Failed to read from closePipe during process start";
                mPid = -1;
                ProcessThread::setPending(-1);
                mReturn = ReturnCrashed;
                return Error;
            } else if (err == 0) {
                // process has started successfully
                eintrwrap(err, ::close(closePipe[0]));
            } else if (err == 1) {
                // process start failed
                eintrwrap(err, ::close(closePipe[0]));
                mErrorString = "Process failed to start";
                mReturn = ReturnCrashed;
                mPid = -1;
                ProcessThread::setPending(-1);
                return Error;
            }
        }

        ProcessThread::addPid(mPid, this, (mMode == Async));

        //printf("fork, about to add fds: stdin=%d, stdout=%d, stderr=%d\n", mStdIn[1], mStdOut[0], mStdErr[0]);
        if (mMode == Async) {
            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                loop->registerSocket(mStdOut[0], EventLoop::SocketRead, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
                loop->registerSocket(mStdErr[0], EventLoop::SocketRead, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
            }
        } else {
            // select and stuff
            timeval started, now, timeoutForSelect;
            if (timeout > 0) {
                Rct::gettime(&started);
                timeoutForSelect.tv_sec = timeout / 1000;
                timeoutForSelect.tv_usec = (timeout % 1000) * 1000;
            }
            if (!(execFlags & NoCloseStdIn)) {
                closeStdIn(CloseForce);
                mWantStdInClosed = false;
            }
            for (;;) {
                // set up all the select crap
                fd_set rfds, wfds;
                FD_ZERO(&rfds);
                FD_ZERO(&wfds);
                int max = 0;
                FD_SET(mStdOut[0], &rfds);
                max = std::max(max, mStdOut[0]);
                FD_SET(mStdErr[0], &rfds);
                max = std::max(max, mStdErr[0]);
                FD_SET(mSync[0], &rfds);
                max = std::max(max, mSync[0]);
                if (mStdIn[1] != -1) {
                    FD_SET(mStdIn[1], &wfds);
                    max = std::max(max, mStdIn[1]);
                }
                int ret;
                eintrwrap(ret, ::select(max + 1, &rfds, &wfds, 0, timeout > 0 ? &timeoutForSelect : 0));
                if (ret == -1) { // ow
                    mErrorString = "Sync select failed: ";
                    mErrorString += Rct::strerror();
                    return Error;
                }
                // check fds and stuff
                if (FD_ISSET(mStdOut[0], &rfds))
                    handleOutput(mStdOut[0], mStdOutBuffer, mStdOutIndex, mReadyReadStdOut);
                if (FD_ISSET(mStdErr[0], &rfds))
                    handleOutput(mStdErr[0], mStdErrBuffer, mStdErrIndex, mReadyReadStdErr);
                if (mStdIn[1] != -1 && FD_ISSET(mStdIn[1], &wfds))
                    handleInput(mStdIn[1]);
                if (FD_ISSET(mSync[0], &rfds)) {
                    // we're done
                    {
                        std::lock_guard<std::mutex> lock(mMutex);
                        assert(mSync[1] == -1);

                        // try to read all remaining data on stdout and stderr
                        handleOutput(mStdOut[0], mStdOutBuffer, mStdOutIndex, mReadyReadStdOut);
                        handleOutput(mStdErr[0], mStdErrBuffer, mStdErrIndex, mReadyReadStdErr);

                        closeStdOut();
                        closeStdErr();

                        int w;
                        eintrwrap(w, ::close(mSync[0]));
                        mSync[0] = -1;
                    }
                    mFinished(this);
                    return Done;
                }
                if (timeout) {
                    Rct::gettime(&now);

                    // lasted is the amount of time we spent until now in ms
                    const int lasted = Rct::timevalDiff(&now, &started);
                    if (lasted >= timeout) {
                        // timeout, we're done
                        kill(); // attempt to kill

                        // we need to remove this Process object from
                        // ProcessThread, because ProcessThread will try to
                        // finish() this object. However, this object may
                        // already have been deleted *before* ProcessThread
                        // runs, creating a segfault.
                        ProcessThread::removePid(mPid);

                        mErrorString = "Timed out";
                        return TimedOut;
                    }

                    // (timeout - lasted) is guaranteed to be > 0 because of
                    // the check above.
                    timeoutForSelect.tv_sec = (timeout - lasted) / 1000;
                    timeoutForSelect.tv_usec = ((timeout - lasted) % 1000) * 1000;
                }
            }
        }
    }
    return Done;
}